

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<FunctionDef>::growAppend
          (QCommonArrayOps<FunctionDef> *this,FunctionDef *b,FunctionDef *e)

{
  long n;
  FunctionDef *pFVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<FunctionDef> local_48;
  FunctionDef *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 4) * 0x4ec4ec4ec4ec4ec5;
    local_48.d = (Data *)0x0;
    local_48.ptr = (FunctionDef *)0x0;
    local_48.size = 0;
    pFVar1 = (this->super_Type).super_QGenericArrayOps<FunctionDef>.
             super_QArrayDataPointer<FunctionDef>.ptr;
    if ((b < pFVar1) ||
       (pFVar1 + (this->super_Type).super_QGenericArrayOps<FunctionDef>.
                 super_QArrayDataPointer<FunctionDef>.size <= b)) {
      QArrayDataPointer<FunctionDef>::detachAndGrow
                ((QArrayDataPointer<FunctionDef> *)this,GrowsAtEnd,n,(FunctionDef **)0x0,
                 (QArrayDataPointer<FunctionDef> *)0x0);
      pFVar1 = b;
    }
    else {
      QArrayDataPointer<FunctionDef>::detachAndGrow
                ((QArrayDataPointer<FunctionDef> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pFVar1 = local_28;
    }
    QGenericArrayOps<FunctionDef>::copyAppend
              ((QGenericArrayOps<FunctionDef> *)this,pFVar1,
               (FunctionDef *)(((long)e - (long)b) + (long)pFVar1));
    QArrayDataPointer<FunctionDef>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }